

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.h
# Opt level: O1

void __thiscall
program_options::too_many_positional_options_error::too_many_positional_options_error
          (too_many_positional_options_error *this)

{
  long *local_38 [2];
  long local_28 [2];
  
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_38,
             "too many positional options have been specified on the command line","");
  std::logic_error::logic_error((logic_error *)this,(string *)local_38);
  *(undefined ***)&this->super_error = &PTR__logic_error_0011f8d8;
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  *(undefined ***)&this->super_error = &PTR__logic_error_0011fa08;
  return;
}

Assistant:

too_many_positional_options_error()
     : error("too many positional options have been specified on the command line")
    {}